

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall wabt::interp::Thread::DoSimdSwizzle(Thread *this)

{
  u8 i;
  long lVar1;
  uchar uVar2;
  Simd<unsigned_char,_(unsigned_char)__x10_> SVar3;
  S result;
  Simd<unsigned_char,_(unsigned_char)__x10_> lhs;
  Simd<unsigned_char,_(unsigned_char)__x10_> rhs;
  Simd<unsigned_char,_(unsigned_char)__x10_> local_38;
  uchar local_28 [16];
  uchar local_18 [16];
  
  local_18 = (uchar  [16])Pop<wabt::interp::Simd<unsigned_char,(unsigned_char)16>>(this);
  SVar3 = Pop<wabt::interp::Simd<unsigned_char,(unsigned_char)16>>(this);
  local_28[0] = SVar3.v[0];
  local_28[1] = SVar3.v[1];
  local_28[2] = SVar3.v[2];
  local_28[3] = SVar3.v[3];
  local_28[4] = SVar3.v[4];
  local_28[5] = SVar3.v[5];
  local_28[6] = SVar3.v[6];
  local_28[7] = SVar3.v[7];
  local_28[8] = SVar3.v[8];
  local_28[9] = SVar3.v[9];
  local_28[10] = SVar3.v[10];
  local_28[0xb] = SVar3.v[0xb];
  local_28[0xc] = SVar3.v[0xc];
  local_28[0xd] = SVar3.v[0xd];
  local_28[0xe] = SVar3.v[0xe];
  local_28[0xf] = SVar3.v[0xf];
  lVar1 = 0;
  do {
    if ((ulong)local_18[lVar1] < 0x10) {
      uVar2 = local_28[local_18[lVar1]];
    }
    else {
      uVar2 = '\0';
    }
    local_38.v[lVar1] = uVar2;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x10);
  Push<wabt::interp::Simd<unsigned_char,(unsigned_char)16>>(this,local_38);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdSwizzle() {
  using S = u8x16;
  auto rhs = Pop<S>();
  auto lhs = Pop<S>();
  S result;
  for (u8 i = 0; i < S::lanes; ++i) {
    result[i] = rhs[i] < S::lanes ? lhs[rhs[i]] : 0;
  }
  Push(result);
  return RunResult::Ok;
}